

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>
::_reduce_boundary<std::initializer_list<unsigned_int>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>
          *this,ID_index cellID,initializer_list<unsigned_int> *boundary,Dimension dim)

{
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>
  *targetColumn;
  undefined4 uVar1;
  size_type sVar2;
  iterator __position;
  ID_index IVar3;
  Column_dimension_option CVar4;
  ID_index IVar5;
  pointer puVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  _List_node_base *p_Var12;
  iterator iVar13;
  Column *col;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>
  *__k;
  uint *puVar14;
  undefined8 *puVar15;
  pointer puVar16;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>
  *pCVar17;
  long *plVar18;
  ulong uVar19;
  undefined8 *puVar20;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>
  *source;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainsInH;
  Tmp_column column;
  _List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> local_b0;
  ID_index local_a4;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>
  *local_a0;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_98;
  ID_index local_90;
  anon_class_1_0_00000001 local_8b;
  anon_class_1_0_00000001 local_8a;
  anon_class_1_0_00000001 local_89;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>
  *local_70;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_68;
  ulong local_38;
  
  uVar19 = (ulong)(uint)dim;
  local_a0 = this;
  local_90 = cellID;
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<unsigned_int_const*>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_68,
             boundary->_M_array,boundary->_M_array + boundary->_M_len);
  sVar2 = boundary->_M_len;
  local_98 = (vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__;
  if (dim == -1) {
    if (sVar2 != 0) {
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar19 = (ulong)((int)sVar2 - 1);
      goto LAB_001bac19;
    }
    dim = 0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (sVar2 != 0) {
LAB_001bac19:
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (uint *)0x0;
      lVar11 = std::_Rb_tree_decrement(&local_68._M_impl.super__Rb_tree_header._M_header);
      pCVar17 = local_a0;
      local_70 = local_a0 + 0xb0;
      lVar11 = (ulong)*(uint *)(*(long *)(local_a0 + 200) + (ulong)*(uint *)(lVar11 + 0x20) * 4) *
               0x40;
      uVar8 = *(uint *)(*(long *)(local_a0 + 0xb0) + 0x18 + lVar11);
      local_38 = uVar19;
      if (uVar8 == 0xffffffff) goto LAB_001bb0b3;
      lVar11 = *(long *)(local_a0 + 0xb0) + lVar11;
LAB_001bac71:
      plVar18 = *(long **)(lVar11 + 0x30);
      if (plVar18 != (long *)(lVar11 + 0x30)) {
        do {
          local_b0._M_node._0_4_ = (int)plVar18[2];
          pVar21 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_68,(uint *)&local_b0);
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_68,(_Base_ptr)pVar21.first._M_node);
          }
          plVar18 = (long *)*plVar18;
        } while (plVar18 != (long *)(lVar11 + 0x30));
        uVar8 = *(uint *)(lVar11 + 0x18);
      }
      local_b0._M_node._0_4_ = uVar8;
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_b0);
      }
      else {
        *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar8;
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (local_68._M_impl.super__Rb_tree_header._M_node_count != 0) goto code_r0x001bacdf;
      local_a4 = local_90;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&local_68,&local_a4);
      puVar6 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar16 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          puVar15 = (undefined8 *)(*(long *)local_70 + (ulong)*puVar16 * 0x40 + 0x30);
          for (puVar20 = (undefined8 *)*puVar15; puVar20 != puVar15;
              puVar20 = (undefined8 *)*puVar20) {
            local_b0._M_node._0_4_ = *(undefined4 *)(puVar20 + 2);
            pVar21 = std::
                     _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::_M_insert_unique<unsigned_int>(&local_68,(uint *)&local_b0);
            if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)&local_68,(_Base_ptr)pVar21.first._M_node);
            }
          }
          puVar16 = puVar16 + 1;
        } while (puVar16 != puVar6);
      }
      pCVar17 = local_a0;
      local_b0._M_node._0_4_ = *(undefined4 *)(local_a0 + 0xe0);
      local_a4 = (ID_index)local_38;
      lVar11 = std::_Rb_tree_decrement(&local_68._M_impl.super__Rb_tree_header._M_header);
      uVar8 = *(uint *)(lVar11 + 0x20);
      std::
      vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>>>
      ::
      emplace_back<unsigned_int&,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>::Column_z2_settings*&>
                ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>>>
                  *)local_70,(uint *)&local_b0,
                 (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &local_68,(int *)&local_a4,
                 (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                  **)(pCVar17 + 0xa8),(Column_z2_settings **)(pCVar17 + 0xe8));
      *(uint *)(*(long *)(local_a0 + 200) + (ulong)uVar8 * 4) = (uint)local_b0._M_node;
      p_Var12 = (_List_node_base *)operator_new(0x20);
      pCVar17 = local_a0;
      __k = local_a0 + 0x70;
      uVar1 = *(undefined4 *)(local_a0 + 0x70);
      *(int *)&p_Var12[1]._M_next = (int)local_38;
      *(undefined4 *)((long)&p_Var12[1]._M_next + 4) = uVar1;
      *(undefined4 *)&p_Var12[1]._M_prev = 0xffffffff;
      std::__detail::_List_node_base::_M_hook(p_Var12);
      *(long *)(pCVar17 + 0x30) = *(long *)(pCVar17 + 0x30) + 1;
      local_b0._M_node = *(_List_node_base **)(pCVar17 + 0x28);
      std::__detail::
      _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
                ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)(pCVar17 + 0x38),(const_iterator)0x0,(uint *)__k,&local_b0);
      pCVar17 = local_a0;
      goto LAB_001baf48;
    }
  }
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_68,&local_90);
  pCVar17 = local_a0;
  local_b0._M_node._0_4_ = *(undefined4 *)(local_a0 + 0xe0);
  local_a4 = dim;
  lVar11 = std::_Rb_tree_decrement(&local_68._M_impl.super__Rb_tree_header._M_header);
  uVar8 = *(uint *)(lVar11 + 0x20);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>>>
  ::
  emplace_back<unsigned_int&,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>::Column_z2_settings*&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>>>
              *)(pCVar17 + 0xb0),(uint *)&local_b0,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_68,
             (int *)&local_a4,
             (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
              **)(pCVar17 + 0xa8),(Column_z2_settings **)(pCVar17 + 0xe8));
  *(uint *)(*(long *)(pCVar17 + 200) + (ulong)uVar8 * 4) = (uint)local_b0._M_node;
  p_Var12 = (_List_node_base *)operator_new(0x20);
  __k = pCVar17 + 0x70;
  uVar1 = *(undefined4 *)(pCVar17 + 0x70);
  *(Dimension *)&p_Var12[1]._M_next = dim;
  *(undefined4 *)((long)&p_Var12[1]._M_next + 4) = uVar1;
  *(undefined4 *)&p_Var12[1]._M_prev = 0xffffffff;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  *(long *)(pCVar17 + 0x30) = *(long *)(pCVar17 + 0x30) + 1;
  local_b0._M_node = *(_List_node_base **)(pCVar17 + 0x28);
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(pCVar17 + 0x38),(const_iterator)0x0,(uint *)__k,&local_b0);
LAB_001baf48:
  *(uint *)__k = *(uint *)__k + 1;
  goto LAB_001bb2ce;
code_r0x001bacdf:
  lVar11 = std::_Rb_tree_decrement(&local_68._M_impl.super__Rb_tree_header._M_header);
  lVar10 = (ulong)*(uint *)(*(long *)(pCVar17 + 200) + (ulong)*(uint *)(lVar11 + 0x20) * 4) * 0x40;
  lVar11 = *(long *)(pCVar17 + 0xb0) + lVar10;
  uVar8 = *(uint *)(*(long *)(pCVar17 + 0xb0) + 0x18 + lVar10);
  if (uVar8 == 0xffffffff) goto LAB_001bafad;
  goto LAB_001bac71;
LAB_001bafad:
  do {
    lVar10 = std::_Rb_tree_decrement(&local_68._M_impl.super__Rb_tree_header._M_header);
    lVar11 = *(long *)(pCVar17 + 0xb0);
    uVar8 = *(uint *)(*(long *)(pCVar17 + 200) + (ulong)*(uint *)(lVar10 + 0x20) * 4);
    lVar10 = (ulong)uVar8 * 0x40;
    uVar9 = *(uint *)(lVar11 + 0x18 + lVar10);
    if (uVar9 == 0xffffffff) {
      puVar15 = (undefined8 *)(lVar11 + lVar10 + 0x30);
      local_a4 = uVar8;
      for (puVar20 = (undefined8 *)*puVar15; puVar20 != puVar15; puVar20 = (undefined8 *)*puVar20) {
        local_b0._M_node._0_4_ = *(undefined4 *)(puVar20 + 2);
        pVar21 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::_M_insert_unique<unsigned_int>(&local_68,(uint *)&local_b0);
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_68,(_Base_ptr)pVar21.first._M_node);
        }
      }
      __position._M_current = *(uint **)(local_98 + 8);
      if (__position._M_current == *(uint **)(local_98 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_98,__position,&local_a4);
      }
      else {
        *__position._M_current = local_a4;
        *(uint **)(local_98 + 8) = __position._M_current + 1;
      }
    }
    else {
      lVar11 = lVar11 + lVar10;
      plVar18 = *(long **)(lVar11 + 0x30);
      if (plVar18 != (long *)(lVar11 + 0x30)) {
        do {
          local_b0._M_node._0_4_ = (int)plVar18[2];
          pVar21 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_68,(uint *)&local_b0);
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_68,(_Base_ptr)pVar21.first._M_node);
          }
          plVar18 = (long *)*plVar18;
        } while (plVar18 != (long *)(lVar11 + 0x30));
        uVar9 = *(uint *)(lVar11 + 0x18);
      }
      local_b0._M_node._0_4_ = uVar9;
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_b0);
      }
      else {
        *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar9;
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
LAB_001bb0b3:
  } while (local_68._M_impl.super__Rb_tree_header._M_node_count != 0);
  puVar14 = *(uint **)local_98 + 1;
  if (puVar14 != *(uint **)(local_98 + 8)) {
    lVar11 = (ulong)**(uint **)local_98 * 0x40;
    do {
      lVar10 = *(long *)local_70;
      targetColumn = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>
                      *)(lVar10 + lVar11);
      uVar8 = *(uint *)(lVar10 + 0x14 + lVar11);
      source = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>
                *)((ulong)*puVar14 * 0x40 + lVar10);
      local_b0._M_node = (_List_node_base *)targetColumn;
      bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::pers___istence_matrix::Column_types)7,true,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (source,targetColumn,(anon_class_1_0_00000001 *)&local_a4,
                         (anon_class_8_1_e4bd5e45 *)&local_b0,&local_89,&local_8a,&local_8b);
      if (bVar7) {
        CVar4.dim_ = (targetColumn->super_Column_dimension_option).dim_;
        IVar5 = (targetColumn->super_Chain_column_option).pivot_;
        IVar3 = (source->super_Chain_column_option).pivot_;
        targetColumn->super_Column_dimension_option =
             (Column_dimension_option)(source->super_Column_dimension_option).dim_;
        (targetColumn->super_Chain_column_option).pivot_ = IVar3;
        source->super_Column_dimension_option = (Column_dimension_option)CVar4.dim_;
        (source->super_Chain_column_option).pivot_ = IVar5;
      }
      uVar9 = (targetColumn->super_Chain_column_option).pivot_;
      if (uVar8 != uVar9) {
        lVar10 = *(long *)(pCVar17 + 200);
        uVar1 = *(undefined4 *)(lVar10 + (ulong)uVar8 * 4);
        *(undefined4 *)(lVar10 + (ulong)uVar8 * 4) = *(undefined4 *)(lVar10 + (ulong)uVar9 * 4);
        *(undefined4 *)(lVar10 + (ulong)uVar9 * 4) = uVar1;
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != *(uint **)(local_98 + 8));
  }
  local_a4 = local_90;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_68,&local_a4);
  puVar6 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar16 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      puVar15 = (undefined8 *)(*(long *)local_70 + (ulong)*puVar16 * 0x40 + 0x30);
      for (puVar20 = (undefined8 *)*puVar15; puVar20 != puVar15; puVar20 = (undefined8 *)*puVar20) {
        local_b0._M_node._0_4_ = *(undefined4 *)(puVar20 + 2);
        pVar21 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::_M_insert_unique<unsigned_int>(&local_68,(uint *)&local_b0);
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_68,(_Base_ptr)pVar21.first._M_node);
        }
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar6);
  }
  pCVar17 = local_a0;
  uVar8 = **(uint **)local_98;
  local_a4 = (ID_index)local_38;
  local_b0._M_node._0_4_ = *(undefined4 *)(local_a0 + 0xe0);
  lVar11 = std::_Rb_tree_decrement(&local_68._M_impl.super__Rb_tree_header._M_header);
  uVar9 = *(uint *)(lVar11 + 0x20);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>>>
  ::
  emplace_back<unsigned_int&,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>::Column_z2_settings*&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,false,true>>>>>
              *)local_70,(uint *)&local_b0,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_68,
             (int *)&local_a4,
             (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
              **)(pCVar17 + 0xa8),(Column_z2_settings **)(pCVar17 + 0xe8));
  *(uint *)(*(long *)(local_a0 + 200) + (ulong)uVar9 * 4) = (uint)local_b0._M_node;
  uVar9 = *(uint *)(local_a0 + 0xe0);
  lVar11 = *(long *)(local_a0 + 0xb0);
  *(uint *)(lVar11 + 0x18 + (ulong)uVar9 * 0x40) = uVar8;
  *(uint *)(lVar11 + 0x18 + (ulong)uVar8 * 0x40) = uVar9;
  local_b0._M_node._0_4_ = uVar8;
  this_00 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(local_a0 + 0x38);
  iVar13 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(this_00,(key_type *)&local_b0);
  if (iVar13.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  pCVar17 = local_a0 + 0x70;
  *(undefined4 *)
   (*(long *)((long)iVar13.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
                    ._M_cur + 0x10) + 0x18) = *(undefined4 *)(local_a0 + 0x70);
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)this_00,(const_iterator)0x0,(uint *)pCVar17,
             (_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> *)
             ((long)iVar13.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
                    ._M_cur + 0x10));
  *(uint *)pCVar17 = *(uint *)pCVar17 + 1;
  pCVar17 = local_a0;
LAB_001bb2ce:
  *(int *)(pCVar17 + 0xe0) = *(int *)(pCVar17 + 0xe0) + 1;
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_68);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}